

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int setDateTimeToCurrent(sqlite3_context *context,DateTime *p)

{
  bool bVar1;
  sqlite3_int64 sVar2;
  DateTime *in_RSI;
  sqlite3_context *in_RDI;
  uint local_4;
  
  sVar2 = sqlite3StmtCurrentTime(in_RDI);
  in_RSI->iJD = sVar2;
  bVar1 = in_RSI->iJD < 1;
  if (!bVar1) {
    in_RSI->validJD = '\x01';
    in_RSI->field_0x2c = in_RSI->field_0x2c & 0xf7 | 8;
    in_RSI->field_0x2c = in_RSI->field_0x2c & 0xef;
    clearYMD_HMS_TZ(in_RSI);
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

static int setDateTimeToCurrent(sqlite3_context *context, DateTime *p){
  p->iJD = sqlite3StmtCurrentTime(context);
  if( p->iJD>0 ){
    p->validJD = 1;
    p->isUtc = 1;
    p->isLocal = 0;
    clearYMD_HMS_TZ(p);
    return 0;
  }else{
    return 1;
  }
}